

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O1

void PrintInstruction(OutputContext *ctx,char *constantData,ExternFuncInfo *functionData,
                     char *symbolData,RegVmInstructionCode code,uchar rA,uchar rB,uchar rC,
                     uint argument,VmConstant *constant)

{
  char *pcVar1;
  ulong uVar2;
  uchar value;
  VmValueType memoryType;
  
  pcVar1 = GetInstructionName(code);
  Print(ctx,"%s ",pcVar1);
  value = (uchar)(argument >> 0x10);
  switch(code) {
  case rviNop:
    return;
  case rviLoadByte:
  case rviLoadWord:
  case rviLoadFloat:
  case rviStoreByte:
  case rviStoreWord:
  case rviStoreDword:
  case rviStoreLong:
  case rviStoreFloat:
  case rviStoreDouble:
  case rviGetAddr:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    memoryType = VM_TYPE_VOID;
    goto LAB_001a9311;
  case rviLoadDword:
    PrintRegister(ctx,rA);
    goto LAB_001a91ca;
  case rviLoadLong:
    PrintRegister(ctx,rA);
    goto LAB_001a9224;
  case rviLoadDouble:
    PrintRegister(ctx,rA);
    goto LAB_001a927e;
  case rviLoadImm:
  case rviFuncAddr:
  case rviTypeid:
    goto LAB_001a9358;
  case rviCombinedd:
  case rviBreakupdd:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
    goto LAB_001a92b9;
  case rviMov:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rC);
    switch(rB) {
    case '\0':
      goto switchD_001a95f9_caseD_0;
    case '\x01':
switchD_001a95f9_caseD_1:
      pcVar1 = " (int)";
      goto LAB_001a977e;
    case '\x02':
switchD_001a95f9_caseD_2:
      pcVar1 = " (double)";
      goto LAB_001a977e;
    case '\x03':
switchD_001a95f9_caseD_3:
      pcVar1 = " (long)";
      goto LAB_001a977e;
    default:
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                    ,0x174,
                    "void PrintInstruction(OutputContext &, char *, ExternFuncInfo *, char *, RegVmInstructionCode, unsigned char, unsigned char, unsigned char, unsigned int, VmConstant *)"
                   );
    }
  case rviMovMult:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rC);
    Print(ctx,(&PTR_anon_var_dwarf_128e8d_00249c30)[rB & 3]);
    if (0xffffff < argument) {
      Print(ctx,"; ");
      PrintRegister(ctx,(uchar)(argument >> 0x18));
      Print(ctx,", ");
      PrintRegister(ctx,value);
      Print(ctx,*(char **)((long)&PTR_anon_var_dwarf_128e8d_00249c30 + (ulong)(rB & 0xc) * 2));
    }
    if ((argument & 0xff00) == 0) {
      return;
    }
    Print(ctx,"; ");
    PrintRegister(ctx,(uchar)(argument >> 8));
    Print(ctx,", ");
    PrintRegister(ctx,(uchar)argument);
    switch(rB >> 4 & 3) {
    case 1:
      goto switchD_001a95f9_caseD_1;
    case 2:
      goto switchD_001a95f9_caseD_2;
    case 3:
      goto switchD_001a95f9_caseD_3;
    }
switchD_001a95f9_caseD_0:
    pcVar1 = " (full)";
LAB_001a977e:
    Print(ctx,pcVar1);
    return;
  case rviDtoi:
  case rviDtol:
  case rviDtof:
  case rviItod:
  case rviLtod:
  case rviItol:
  case rviLtoi:
  case rviNeg:
  case rviNegl:
  case rviNegd:
  case rviBitNot:
  case rviBitNotl:
  case rviLogNot:
  case rviLogNotl:
    PrintRegister(ctx,rA);
LAB_001a92b9:
    Print(ctx,", ");
    PrintRegister(ctx,rC);
    return;
  case rviIndex:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
    Print(ctx,", ");
    PrintRegister(ctx,rC);
    Print(ctx,", ");
    if (constant == (VmConstant *)0x0) {
      PrintRegister(ctx,value);
      uVar2 = (ulong)(argument & 0xffff);
    }
    else {
      PrintRegister(ctx,*(uchar *)((long)&constant->iValue + 2));
      uVar2 = (ulong)(ushort)constant->iValue;
    }
    Print(ctx,", %d",uVar2);
    return;
  case rviSetRange:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    if (5 < rB) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                    ,0x1fe,
                    "void PrintInstruction(OutputContext &, char *, ExternFuncInfo *, char *, RegVmInstructionCode, unsigned char, unsigned char, unsigned char, unsigned int, VmConstant *)"
                   );
    }
    Print(ctx,&DAT_0020aee0 + *(int *)(&DAT_0020aee0 + (ulong)rB * 4));
    break;
  case rviMemCopy:
    PrintRegister(ctx,rA);
    break;
  case rviJmp:
    goto switchD_001a9196_caseD_1d;
  case rviJmpz:
  case rviJmpnz:
    rA = rC;
LAB_001a9358:
    PrintRegister(ctx,rA);
    goto LAB_001a96c8;
  case rviCall:
    if (constant == (VmConstant *)0x0) {
      if (functionData == (ExternFuncInfo *)0x0) {
        Print(ctx,"%d",(ulong)argument);
      }
      else {
        Print(ctx,"%s#%d",symbolData + functionData[argument].offsetToName);
      }
    }
    else {
      PrintConstant(ctx,constant);
    }
    argument = (uint)rC | (uint)rB << 8 | (uint)rA << 0x10;
    goto LAB_001a9833;
  case rviCallPtr:
    PrintRegister(ctx,rC);
LAB_001a9833:
    PrintCall(ctx,constantData,argument);
    return;
  case rviReturn:
    if (rC != '\0') {
      Print(ctx,"checked ");
    }
    if (rB < 6) {
      Print(ctx,&DAT_0020aef8 + *(int *)(&DAT_0020aef8 + (ulong)rB * 4));
      if (rB == '\x05') {
        return;
      }
      PrintReturn(ctx,constantData,argument);
      return;
    }
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                  ,0x23d,
                  "void PrintInstruction(OutputContext &, char *, ExternFuncInfo *, char *, RegVmInstructionCode, unsigned char, unsigned char, unsigned char, unsigned int, VmConstant *)"
                 );
  case rviAddImm:
  case rviAddImml:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    rC = rB;
    goto LAB_001a96ba;
  case rviAdd:
  case rviSub:
  case rviMul:
  case rviDiv:
  case rviPow:
  case rviMod:
  case rviLess:
  case rviGreater:
  case rviLequal:
  case rviGequal:
  case rviEqual:
  case rviNequal:
  case rviShl:
  case rviShr:
  case rviBitAnd:
  case rviBitOr:
  case rviBitXor:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
LAB_001a91ca:
    Print(ctx,", ");
    memoryType = VM_TYPE_INT;
LAB_001a9311:
    PrintAddress(ctx,constantData,rC,argument,constant,memoryType);
    return;
  case rviAddl:
  case rviSubl:
  case rviMull:
  case rviDivl:
  case rviPowl:
  case rviModl:
  case rviLessl:
  case rviGreaterl:
  case rviLequall:
  case rviGequall:
  case rviEquall:
  case rviNequall:
  case rviShll:
  case rviShrl:
  case rviBitAndl:
  case rviBitOrl:
  case rviBitXorl:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
LAB_001a9224:
    Print(ctx,", ");
    memoryType = VM_TYPE_LONG;
    goto LAB_001a9311;
  case rviAddd:
  case rviSubd:
  case rviMuld:
  case rviDivd:
  case rviAddf:
  case rviSubf:
  case rviMulf:
  case rviDivf:
  case rviPowd:
  case rviModd:
  case rviLessd:
  case rviGreaterd:
  case rviLequald:
  case rviGequald:
  case rviEquald:
  case rviNequald:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
LAB_001a927e:
    Print(ctx,", ");
    memoryType = VM_TYPE_DOUBLE;
    goto LAB_001a9311;
  case rviConvertPtr:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
    break;
  default:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                  ,0x2b0,
                  "void PrintInstruction(OutputContext &, char *, ExternFuncInfo *, char *, RegVmInstructionCode, unsigned char, unsigned char, unsigned char, unsigned int, VmConstant *)"
                 );
  }
  Print(ctx,", ");
LAB_001a96ba:
  PrintRegister(ctx,rC);
LAB_001a96c8:
  Print(ctx,", ");
switchD_001a9196_caseD_1d:
  PrintConstant(ctx,argument,constant);
  return;
}

Assistant:

void PrintInstruction(OutputContext &ctx, char *constantData, ExternFuncInfo *functionData, char *symbolData, RegVmInstructionCode code, unsigned char rA, unsigned char rB, unsigned char rC, unsigned argument, VmConstant *constant)
{
	Print(ctx, "%s ", GetInstructionName(code));

	switch(code)
	{
	case rviNop:
		break;
	case rviLoadByte:
	case rviLoadWord:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_VOID);
		break;
	case rviLoadDword:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_INT);
		break;
	case rviLoadLong:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_LONG);
		break;
	case rviLoadFloat:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_VOID);
		break;
	case rviLoadDouble:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_DOUBLE);
		break;
	case rviLoadImm:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviStoreByte:
	case rviStoreWord:
	case rviStoreDword:
	case rviStoreLong:
	case rviStoreFloat:
	case rviStoreDouble:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_VOID);
		break;
	case rviCombinedd:
	case rviBreakupdd:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		break;
	case rviMov:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);

		switch(rB)
		{
		case rvcFull:
			Print(ctx, " (full)");
			break;
		case rvcInt:
			Print(ctx, " (int)");
			break;
		case rvcDouble:
			Print(ctx, " (double)");
			break;
		case rvcLong:
			Print(ctx, " (long)");
			break;
		default:
			assert(!"unknown type");
		}
		break;
	case rviMovMult:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);

		switch(rB & 0x3)
		{
		case rvcFull:
			Print(ctx, " (full)");
			break;
		case rvcInt:
			Print(ctx, " (int)");
			break;
		case rvcDouble:
			Print(ctx, " (double)");
			break;
		case rvcLong:
			Print(ctx, " (long)");
			break;
		default:
			assert(!"unknown type");
		}

		if(argument >> 24)
		{
			Print(ctx, "; ");
			PrintRegister(ctx, argument >> 24);
			Print(ctx, ", ");
			PrintRegister(ctx, (argument >> 16) & 0xff);

			switch((rB >> 2) & 0x3)
			{
			case rvcFull:
				Print(ctx, " (full)");
				break;
			case rvcInt:
				Print(ctx, " (int)");
				break;
			case rvcDouble:
				Print(ctx, " (double)");
				break;
			case rvcLong:
				Print(ctx, " (long)");
				break;
			default:
				assert(!"unknown type");
			}
		}

		if((argument >> 8) & 0xff)
		{
			Print(ctx, "; ");
			PrintRegister(ctx, (argument >> 8) & 0xff);
			Print(ctx, ", ");
			PrintRegister(ctx, argument & 0xff);

			switch((rB >> 4) & 0x3)
			{
			case rvcFull:
				Print(ctx, " (full)");
				break;
			case rvcInt:
				Print(ctx, " (int)");
				break;
			case rvcDouble:
				Print(ctx, " (double)");
				break;
			case rvcLong:
				Print(ctx, " (long)");
				break;
			default:
				assert(!"unknown type");
			}
		}
		break;
	case rviDtoi:
	case rviDtol:
	case rviDtof:
	case rviItod:
	case rviLtod:
	case rviItol:
	case rviLtoi:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		break;
	case rviIndex:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		Print(ctx, ", ");

		if(constant)
		{
			PrintRegister(ctx, (constant->iValue >> 16) & 0xff);
			Print(ctx, ", %d", constant->iValue & 0xffff);
		}
		else
		{
			PrintRegister(ctx, (argument >> 16) & 0xff);
			Print(ctx, ", %d", argument & 0xffff);
		}
		break;
	case rviGetAddr:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_VOID);
		break;
	case rviSetRange:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");

		switch(rB)
		{
		case rvsrDouble:
			Print(ctx, "double");
			break;
		case rvsrFloat:
			Print(ctx, "float");
			break;
		case rvsrLong:
			Print(ctx, "long");
			break;
		case rvsrInt:
			Print(ctx, "int");
			break;
		case rvsrShort:
			Print(ctx, "short");
			break;
		case rvsrChar:
			Print(ctx, "char");
			break;
		default:
			assert(!"unknown type");
		}

		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviMemCopy:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviJmp:
		PrintConstant(ctx, argument, constant);
		break;
	case rviJmpz:
	case rviJmpnz:
		PrintRegister(ctx, rC);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviCall:
		if(constant)
			PrintConstant(ctx, constant);
		else if (functionData)
			Print(ctx, "%s#%d", functionData[argument].offsetToName + symbolData, argument);
		else
			Print(ctx, "%d", argument);

		PrintCall(ctx, constantData, (rA << 16) | (rB << 8) | rC);
		break;
	case rviCallPtr:
		PrintRegister(ctx, rC);
		PrintCall(ctx, constantData, argument);
		break;
	case rviReturn:
		if(rC)
			Print(ctx, "checked ");

		switch(rB)
		{
		case rvrVoid:
			Print(ctx, "void");
			break;
		case rvrDouble:
			Print(ctx, "double");
			break;
		case rvrLong:
			Print(ctx, "long");
			break;
		case rvrInt:
			Print(ctx, "int");
			break;
		case rvrStruct:
			Print(ctx, "struct");
			break;
		case rvrError:
			Print(ctx, "error");
			break;
		default:
			assert(!"unknown type");
		}

		if(rB != rvrError)
			PrintReturn(ctx, constantData, argument);
		break;
	case rviAddImm:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviAdd:
	case rviSub:
	case rviMul:
	case rviDiv:
	case rviPow:
	case rviMod:
	case rviLess:
	case rviGreater:
	case rviLequal:
	case rviGequal:
	case rviEqual:
	case rviNequal:
	case rviShl:
	case rviShr:
	case rviBitAnd:
	case rviBitOr:
	case rviBitXor:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_INT);
		break;
	case rviAddImml:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviAddl:
	case rviSubl:
	case rviMull:
	case rviDivl:
	case rviPowl:
	case rviModl:
	case rviLessl:
	case rviGreaterl:
	case rviLequall:
	case rviGequall:
	case rviEquall:
	case rviNequall:
	case rviShll:
	case rviShrl:
	case rviBitAndl:
	case rviBitOrl:
	case rviBitXorl:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_LONG);
		break;
	case rviAddd:
	case rviSubd:
	case rviMuld:
	case rviDivd:
	case rviAddf:
	case rviSubf:
	case rviMulf:
	case rviDivf:
	case rviPowd:
	case rviModd:
	case rviLessd:
	case rviGreaterd:
	case rviLequald:
	case rviGequald:
	case rviEquald:
	case rviNequald:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_DOUBLE);
		break;
	case rviNeg:
	case rviNegl:
	case rviNegd:
	case rviBitNot:
	case rviBitNotl:
	case rviLogNot:
	case rviLogNotl:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		break;
	case rviConvertPtr:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviFuncAddr:
	case rviTypeid:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	default:
		assert(!"unknown instruction");
	}
}